

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O2

int __thiscall QNetworkReplyImpl::close(QNetworkReplyImpl *this,int __fd)

{
  QNetworkReplyImplPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QNetworkReplyImplPrivate **)(this + 8);
  if (1 < this_00->state - Finished) {
    if (this_00->backend != (QNetworkAccessBackend *)0x0) {
      (**(code **)(*(long *)this_00->backend + 0x70))();
    }
    if ((QObject *)this_00->copyDevice != (QObject *)0x0) {
      __fd = 0;
      QObject::disconnect((QObject *)this_00->copyDevice,(char *)0x0,(QObject *)this,(char *)0x0);
    }
    QNetworkReply::close((QNetworkReply *)this,__fd);
    tr((QString *)&local_30,"Operation canceled",(char *)0x0,-1);
    QNetworkReplyImplPrivate::error(this_00,OperationCanceledError,(QString *)&local_30);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
    QNetworkReplyImplPrivate::finished(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImpl::close()
{
    Q_D(QNetworkReplyImpl);
    if (d->state == QNetworkReplyPrivate::Aborted ||
        d->state == QNetworkReplyPrivate::Finished)
        return;

    // stop the download
    if (d->backend)
        d->backend->close();
    if (d->copyDevice)
        disconnect(d->copyDevice, nullptr, this, nullptr);

    QNetworkReply::close();

    // call finished which will emit signals
    d->error(OperationCanceledError, tr("Operation canceled"));
    d->finished();
}